

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

sexp_conflict
sexp_string_contains
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y,
          sexp_conflict start)

{
  sexp psVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  char *pcVar4;
  
  if ((((ulong)x & 3) != 0) || (x->tag != 9)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,9);
    return psVar3;
  }
  if ((((ulong)y & 3) == 0) && (y->tag == 9)) {
    if (((uint)start & 7) != 2) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0xf,start);
      return psVar3;
    }
    if ((x->value).type.slots < (sexp)((long)start >> 3)) {
      psVar3 = (sexp_conflict)
               sexp_user_exception(ctx,self,"string-contains: start out of range",start);
      return psVar3;
    }
    psVar1 = (x->value).type.name;
    psVar2 = (x->value).type.cpl;
    pcVar4 = strstr((((sexp)((long)start >> 3))->value).flonum_bits +
                    (long)&psVar1->value + (long)&psVar2->tag,
                    (((y->value).type.cpl)->value).flonum_bits +
                    (long)(((y->value).type.name)->value).flonum_bits);
    psVar3 = (sexp_conflict)0x3e;
    if (pcVar4 != (char *)0x0) {
      psVar3 = (sexp_conflict)
               (((long)pcVar4 - (long)((psVar1->value).flonum_bits + 8 + (long)psVar2)) * 8 + 2);
    }
    return psVar3;
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,9,y);
  return psVar3;
}

Assistant:

sexp sexp_string_contains (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y, sexp start) {
  const char *res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, x);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, y);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, start);
  if (sexp_unbox_string_cursor(start) > sexp_string_size(x))
    return sexp_user_exception(ctx, self, "string-contains: start out of range", start);
  res = strstr(sexp_string_data(x) + sexp_unbox_string_cursor(start), sexp_string_data(y));
  return res ? sexp_make_string_cursor(res-sexp_string_data(x)) : SEXP_FALSE;
}